

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall
tetgenmesh::orthosphere
          (tetgenmesh *this,double *pa,double *pb,double *pc,double *pd,double aheight,
          double bheight,double cheight,double dheight,double *orthocent,double *radius)

{
  bool bVar1;
  tetgenmesh *this_00;
  double dVar2;
  int indx [4];
  double D;
  double A [4] [4];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  int local_b8 [6];
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  undefined8 local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  double local_40;
  undefined8 local_38;
  double local_30;
  double local_28;
  double local_20;
  
  this_00 = (tetgenmesh *)0x3ff0000000000000;
  local_98 = 1.0;
  local_90 = *pa;
  local_88 = pa[1];
  local_80 = pa[2];
  local_78 = 0x3ff0000000000000;
  local_70 = *pb;
  local_68 = pb[1];
  local_60 = pb[2];
  local_58 = 0x3ff0000000000000;
  local_50 = *pc;
  local_48 = pc[1];
  local_40 = pc[2];
  local_38 = 0x3ff0000000000000;
  local_30 = *pd;
  local_28 = pd[1];
  local_20 = pd[2];
  local_d8 = aheight * 0.5;
  local_d0 = bheight * 0.5;
  local_c8 = cheight * 0.5;
  local_c0 = dheight * 0.5;
  bVar1 = lu_decmp((tetgenmesh *)0x3ff0000000000000,(double (*) [4])&local_98,4,local_b8,&local_a0,0
                  );
  if (bVar1) {
    lu_solve(this_00,(double (*) [4])&local_98,4,local_b8,&local_d8,0);
    if (orthocent != (double *)0x0) {
      *orthocent = local_d0;
      orthocent[1] = local_c8;
      orthocent[2] = local_c0;
    }
    if (radius == (double *)0x0) {
      return bVar1;
    }
    dVar2 = local_d8 + local_d8 + local_c0 * local_c0 + local_d0 * local_d0 + local_c8 * local_c8;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
  }
  else {
    dVar2 = 0.0;
    if (radius == (double *)0x0) {
      return bVar1;
    }
  }
  *radius = dVar2;
  return bVar1;
}

Assistant:

bool tetgenmesh::orthosphere(REAL* pa, REAL* pb, REAL* pc, REAL* pd,
                             REAL  aheight, REAL bheight, REAL cheight, 
                             REAL  dheight, REAL* orthocent, REAL* radius)
{
  REAL A[4][4], rhs[4], D;
  int indx[4];

  // Set the coefficient matrix A (4 x 4).
  A[0][0] = 1.0; A[0][1] = pa[0]; A[0][2] = pa[1]; A[0][3] = pa[2];
  A[1][0] = 1.0; A[1][1] = pb[0]; A[1][2] = pb[1]; A[1][3] = pb[2];
  A[2][0] = 1.0; A[2][1] = pc[0]; A[2][2] = pc[1]; A[2][3] = pc[2];
  A[3][0] = 1.0; A[3][1] = pd[0]; A[3][2] = pd[1]; A[3][3] = pd[2];

  // Set the right hand side vector (4 x 1).
  rhs[0] = 0.5 * aheight;
  rhs[1] = 0.5 * bheight;
  rhs[2] = 0.5 * cheight;
  rhs[3] = 0.5 * dheight;

  // Solve the 4 by 4 equations use LU decomposition with partial pivoting
  //   and backward and forward substitute..
  if (!lu_decmp(A, 4, indx, &D, 0)) {
    if (radius != (REAL *) NULL) *radius = 0.0;
    return false;
  }
  lu_solve(A, 4, indx, rhs, 0);

  if (orthocent != (REAL *) NULL) {
    orthocent[0] = rhs[1];
    orthocent[1] = rhs[2];
    orthocent[2] = rhs[3];
  }
  if (radius != (REAL *) NULL) {
    // rhs[0] = - rheight / 2;
    // rheight  = - 2 * rhs[0];
    //          =  r[0]^2 + r[1]^2 + r[2]^2 - radius^2
    // radius^2 = r[0]^2 + r[1]^2 + r[2]^2 -rheight
    //          = r[0]^2 + r[1]^2 + r[2]^2 + 2 * rhs[0]
    *radius = sqrt(rhs[1] * rhs[1] + rhs[2] * rhs[2] + rhs[3] * rhs[3]
                   + 2.0 * rhs[0]);
  }
  return true;
}